

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O2

Name wasm::Names::
     getValidNameGivenExisting<std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
               (Name root,
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               *existingNames)

{
  ulong uVar1;
  string *in_R9;
  Name root_00;
  IString IVar2;
  string local_68 [32];
  _Any_data local_48;
  code *local_38;
  code *local_30;
  allocator<char> local_21;
  
  root_00.super_IString.str._M_len = root.super_IString.str._M_str;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:129:5)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:129:5)>
             ::_M_manager;
  uVar1 = (existingNames->_M_h)._M_element_count;
  local_48._M_unused._M_object = existingNames;
  std::__cxx11::string::string<std::allocator<char>>(local_68,"_",&local_21);
  root_00.super_IString.str._M_str = (char *)&local_48;
  IVar2.str = (string_view)
              getValidName(root.super_IString.str._M_len,root_00,
                           (function<bool_(wasm::Name)> *)(uVar1 & 0xffffffff),(Index)local_68,in_R9
                          );
  std::__cxx11::string::~string(local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return (IString)(IString)IVar2.str;
}

Assistant:

inline Name getValidNameGivenExisting(Name root, const T& existingNames) {
  return getValidName(
    root,
    [&](Name test) { return !existingNames.count(test); },
    existingNames.size());
}